

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlib_unix.cpp
# Opt level: O2

PTESTFUNC __thiscall trun::DynLibLinux::FindExportedSymbol(DynLibLinux *this,string *symbolName)

{
  PTESTFUNC p_Var1;
  string exportName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_30,symbolName);
  if (*local_30._M_dataplus._M_p == '_') {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&local_30,local_30._M_dataplus._M_p + 1);
  }
  p_Var1 = (PTESTFUNC)dlsym(this->handle,local_30._M_dataplus._M_p);
  if (p_Var1 == (PTESTFUNC)0x0) {
    gnilk::Log::Debug<char_const*,char_const*>
              (this->pLogger,"FindExportedSymbol, unable to find symbol \'%s\'",
               local_30._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return p_Var1;
}

Assistant:

PTESTFUNC DynLibLinux::FindExportedSymbol(const std::string &symbolName) {
  
    std::string exportName = symbolName;
    if (exportName[0] == '_') {
        exportName = &exportName[1];
    }

    void *ptrInvoke = dlsym(handle, exportName.c_str());
    if (ptrInvoke == nullptr) {
        pLogger->Debug("FindExportedSymbol, unable to find symbol '%s'", exportName.c_str());
        return nullptr;
    }
    return (PTESTFUNC)ptrInvoke;
}